

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_json_parser.h
# Opt level: O2

char * flatcc_json_parser_bool(flatcc_json_parser_t *ctx,char *buf,char *end,uint8_t *v)

{
  int iVar1;
  char *pcVar2;
  uint8_t tmp;
  
  if (3 < (long)end - (long)buf) {
    if (*(int *)buf == 0x65757274) {
      *v = '\x01';
      return buf + 4;
    }
    if (((long)end - (long)buf != 4) && (iVar1 = bcmp(buf,"false",5), iVar1 == 0)) {
      *v = '\0';
      return buf + 5;
    }
  }
  pcVar2 = flatcc_json_parser_uint8(ctx,buf,end,&tmp);
  *v = tmp != '\0';
  return pcVar2;
}

Assistant:

static inline const char *flatcc_json_parser_bool(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t *v)
{
    const char *k;
    uint8_t tmp;

    k = buf;
    if (end - buf >= 4 && memcmp(buf, "true", 4) == 0) {
        *v = 1;
        return k + 4;
    } else if (end - buf >= 5 && memcmp(buf, "false", 5) == 0) {
        *v = 0;
        return k + 5;
    }
    buf = flatcc_json_parser_uint8(ctx, buf, end, &tmp);
    *v = !!tmp;
    return buf;
}